

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

string * __thiscall
t_js_generator::function_signature
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,string *prefix,
          bool include_callback)

{
  _func_int **pp_Var1;
  long *plVar2;
  _func_int **pp_Var3;
  t_js_generator *this_00;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_50,prefix,&tfunction->name_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  pp_Var1 = (_func_int **)(local_70 + 0x10);
  pp_Var3 = (_func_int **)(plVar2 + 2);
  if ((_func_int **)*plVar2 == pp_Var3) {
    local_60._M_allocated_capacity = (size_type)*pp_Var3;
    local_60._8_8_ = plVar2[3];
    local_70._0_8_ = pp_Var1;
  }
  else {
    local_60._M_allocated_capacity = (size_type)*pp_Var3;
    local_70._0_8_ = (_func_int **)*plVar2;
  }
  local_70._8_8_ = plVar2[1];
  this_00 = (t_js_generator *)local_70;
  *plVar2 = (long)pp_Var3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
  if ((_func_int **)local_70._0_8_ != pp_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  argument_list_abi_cxx11_((string *)local_70,this_00,tfunction->arglist_,include_callback);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_70._0_8_);
  if ((_func_int **)local_70._0_8_ != pp_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::function_signature(t_function* tfunction,
                                          string prefix,
                                          bool include_callback) {

  string str;

  str = prefix + tfunction->get_name() + " = function(";

  str += argument_list(tfunction->get_arglist(), include_callback);

  str += ")";
  return str;
}